

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDistanceCalculator.cpp
# Opt level: O2

void tellUserTags(vector<int,_std::allocator<int>_> *tags)

{
  int iVar1;
  int *piVar2;
  ostream *this;
  int *piVar3;
  
  std::operator<<((ostream *)&std::cout,"There are these tags: ");
  piVar2 = (tags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar3 = (tags->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar2; piVar3 = piVar3 + 1) {
    iVar1 = *piVar3;
    this = std::operator<<((ostream *)&std::cout," ");
    std::ostream::operator<<(this,iVar1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void tellUserTags(const std::vector<int>& tags){
    std::cout << "There are these tags: ";
    for(auto t : tags) std::cout << " " << t;
    std::cout << std::endl;
}